

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O3

int __thiscall IndexTree::balance(IndexTree *this,int32_t *root)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  Node *pNVar4;
  Node *_old_root;
  int iVar5;
  bool bVar6;
  
  iVar5 = *root;
  pNVar4 = this->nodes;
  if (pNVar4[iVar5].balance_factor < -1) {
    iVar3 = pNVar4[iVar5].left;
    uVar1 = pNVar4[iVar3].balance_factor;
    if (uVar1 != 1) {
      *root = iVar3;
      bVar6 = uVar1 != 0;
      pNVar4[iVar5].left = pNVar4[iVar3].right;
      pNVar4[iVar3].right = iVar5;
      pNVar4[iVar3].balance_factor = uVar1 + 1;
      pNVar4[iVar5].balance_factor = ~uVar1;
      goto LAB_001054b9;
    }
    iVar5 = -1;
  }
  else {
    if (pNVar4[iVar5].balance_factor < 2) {
      bVar6 = false;
      goto LAB_001054b9;
    }
    iVar3 = pNVar4[iVar5].right;
    sVar2 = pNVar4[iVar3].balance_factor;
    if (sVar2 != -1) {
      *root = iVar3;
      bVar6 = sVar2 != 0;
      pNVar4[iVar5].right = pNVar4[iVar3].left;
      pNVar4[iVar3].left = iVar5;
      pNVar4[iVar3].balance_factor = sVar2 + -1;
      pNVar4[iVar5].balance_factor = 1 - sVar2;
      goto LAB_001054b9;
    }
    iVar5 = 1;
  }
  rotateTwice(this,root,iVar5);
  bVar6 = true;
LAB_001054b9:
  return (int)bVar6;
}

Assistant:

int IndexTree::balance(int32_t &root) {
    int height_change = 0;
    auto &_root = nodes[root];
    if (_root.balance_factor < -1) {
        // left unbalanced, need right rotation
        if (nodes[_root.left].balance_factor == 1) {
            // LR rotation
            height_change = rotateTwice(root, -1);
        } else {
            // R rotation
            height_change = rotateOnce(root, 1);
        }
    } else if (_root.balance_factor > 1) {
        // right unbalanced, need left rotation
        if (nodes[_root.right].balance_factor == -1) {
            // RL rotation
            height_change = rotateTwice(root, 1);
        } else {
            // L rotation
            height_change = rotateOnce(root, -1);
        }
    }

    return height_change;
}